

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BigNumber.cpp
# Opt level: O0

BigNumber *
partial_multiplication(BigNumber *__return_storage_ptr__,BigNumber *nb1,BigNumber *nb2,uint r)

{
  bool bVar1;
  ulong uVar2;
  uint uVar3;
  reference pvVar4;
  size_type sVar5;
  BigNumber local_138;
  BigNumber local_118;
  BigNumber local_f8;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_d8;
  undefined1 local_c0 [8];
  BigNumber tmp;
  uint local_98;
  uint right1;
  uint left1;
  uint left2;
  uint right2;
  uint resultat32b;
  uint res4;
  uint res3;
  uint res2;
  uint res1;
  uint low2;
  uint high2;
  unsigned_long j;
  uint low1;
  uint high1;
  vector<unsigned_int,_std::allocator<unsigned_int>_> resultat_intermedaire;
  uint retenue;
  ulong local_38;
  unsigned_long i;
  uint SIZE_INT16;
  uint r_local;
  BigNumber *nb2_local;
  BigNumber *nb1_local;
  BigNumber *resultat;
  
  BigNumber::BigNumber(__return_storage_ptr__,nb1->m_base);
  for (local_38 = 0; uVar3 = Polynome::m_degre(&nb1->super_Polynome), local_38 < uVar3;
      local_38 = local_38 + 1) {
    resultat_intermedaire.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage._0_4_ = 0;
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&low1);
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb1,local_38);
    j._4_4_ = *pvVar4 >> 0x10;
    pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                       ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb1,local_38);
    j._0_4_ = *pvVar4 & 0xffff;
    for (_low2 = 0; uVar2 = _low2,
        sVar5 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size
                          ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb2),
        uVar2 < sVar5; _low2 = _low2 + 1) {
      if (local_38 + _low2 < (ulong)r) {
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb2,_low2);
        res1 = *pvVar4 >> 0x10;
        pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                           ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)nb2,_low2);
        res2 = *pvVar4 & 0xffff;
        res3 = (uint)j * res2;
        res4 = res1 * (uint)j;
        resultat32b = res2 * j._4_4_;
        right2 = j._4_4_ * res1;
        local_98 = (uint)resultat_intermedaire.
                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage >> 0x10;
        uVar3 = (uint)resultat_intermedaire.
                      super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage & 0xffff;
        if ((res3 & 0xffff) < 0x10000 - uVar3) {
          tmp.m_base._4_4_ = (res3 & 0xffff) + uVar3;
        }
        else {
          tmp.m_base._4_4_ = (res3 & 0xffff) + (uVar3 - 0x10000);
          local_98 = local_98 + 1;
        }
        bVar1 = 0x10000 - local_98 <= res3 >> 0x10;
        if (bVar1) {
          local_98 = (res3 >> 0x10) + (local_98 - 0x10000);
        }
        else {
          local_98 = (res3 >> 0x10) + local_98;
        }
        left1 = (uint)bVar1;
        if ((res4 & 0xffff) < 0x10000 - local_98) {
          local_98 = (res4 & 0xffff) + local_98;
        }
        else {
          local_98 = (res4 & 0xffff) + local_98 + -0x10000;
          left1 = left1 + 1;
        }
        if ((resultat32b & 0xffff) < 0x10000 - local_98) {
          local_98 = (resultat32b & 0xffff) + local_98;
        }
        else {
          local_98 = (resultat32b & 0xffff) + local_98 + -0x10000;
          left1 = left1 + 1;
        }
        bVar1 = 0x10000 - left1 <= (right2 & 0xffff);
        if (bVar1) {
          left1 = (right2 & 0xffff) + (left1 - 0x10000);
        }
        else {
          left1 = (right2 & 0xffff) + left1;
        }
        right1 = (uint)bVar1;
        if (res4 >> 0x10 < 0x10000 - left1) {
          left1 = (res4 >> 0x10) + left1;
        }
        else {
          left1 = (res4 >> 0x10) + (left1 - 0x10000);
          right1 = right1 + 1;
        }
        if (resultat32b >> 0x10 < 0x10000 - left1) {
          left1 = (resultat32b >> 0x10) + left1;
        }
        else {
          left1 = (resultat32b >> 0x10) + (left1 - 0x10000);
          right1 = right1 + 1;
        }
        resultat_intermedaire.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0x10000 - right1 <= right2 >> 0x10
        ;
        if (resultat_intermedaire.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage._0_1_) {
          right1 = (right2 >> 0x10) + (right1 - 0x10000);
        }
        else {
          right1 = (right2 >> 0x10) + right1;
        }
        resultat_intermedaire.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._1_3_ = 0;
        resultat_intermedaire.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
             right1 * 0x10000 + left1 +
             (uint)resultat_intermedaire.
                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        left2 = local_98 * 0x10000 + tmp.m_base._4_4_;
        if (nb1->m_base < 0x100000000) {
          uVar2 = (ulong)left2 % (nb1->m_base & 0xffffffff);
          left2 = (uint)uVar2;
          resultat_intermedaire.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
          _M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ =
               (uint)(uVar2 / (nb1->m_base & 0xffffffff));
        }
        std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
                  ((vector<unsigned_int,std::allocator<unsigned_int>> *)&low1,&left2);
      }
    }
    if ((uint)resultat_intermedaire.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage != 0) {
      std::vector<unsigned_int,std::allocator<unsigned_int>>::emplace_back<unsigned_int&>
                ((vector<unsigned_int,std::allocator<unsigned_int>> *)&low1,
                 (uint *)&resultat_intermedaire.
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage);
    }
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::vector
              (&local_d8,(vector<unsigned_int,_std::allocator<unsigned_int>_> *)&low1);
    BigNumber::BigNumber((BigNumber *)local_c0,&local_d8,nb1->m_base);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector(&local_d8);
    BigNumber::operator>>((BigNumber *)local_c0,(int)local_38);
    BigNumber::BigNumber(&local_118,__return_storage_ptr__);
    BigNumber::BigNumber(&local_138,(BigNumber *)local_c0);
    operator+(&local_f8,&local_118,&local_138);
    BigNumber::operator=(__return_storage_ptr__,&local_f8);
    BigNumber::~BigNumber(&local_f8);
    BigNumber::~BigNumber(&local_138);
    BigNumber::~BigNumber(&local_118);
    BigNumber::~BigNumber((BigNumber *)local_c0);
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
              ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)&low1);
  }
  return __return_storage_ptr__;
}

Assistant:

BigNumber partial_multiplication(BigNumber& nb1, BigNumber& nb2, const unsigned int r){
//    clock_t t1, t2;
//    static clock_t t_tmp;
//    static unsigned int cmp = 0;
//    t1 = clock();
    const unsigned int SIZE_INT16 = 65536;
    BigNumber resultat(nb1.m_base);
    for(unsigned long i = 0; i < nb1.m_degre() ; i++) {
        unsigned int retenue = 0;
        vector<unsigned int> resultat_intermedaire;

        /*
         * On split la valeur du m_coef de 32 bits en deux valeurs de 16 bits
         * On a m_coef = [high1 low1]
         */
        const unsigned int high1 = (nb1.m_coef[i] >> 16);
        const unsigned int low1 = (nb1.m_coef[i] & 0x0000FFFF);

        for (unsigned long j = 0; j < nb2.m_coef.size(); j++) {
            /*
             * Calcul des résultats intermédiaires des sous-blocks de 16bits des opérandes
             */
            if(i + j < r) {

                const unsigned int high2 = (nb2.m_coef[j] >> 16);
                const unsigned int low2 = (nb2.m_coef[j] & 0x0000FFFF);

                /*
                 * On multiplie de nombre de 16 bits; le résultat sera inferieur a 32bits donc pas d'overflow
                 */
                const unsigned int res1 = low1 * low2;
                const unsigned int res2 = high2 * low1;
                const unsigned int res3 = low2 * high1;
                const unsigned int res4 = high1 * high2;


                /*
                 * Calcul du résultat de la multiplication sur 32 bits
                 */


                unsigned int resultat32b = 0;

                /*
                 * Le resultat de la multiplication est donné par [left1, right1]
                 * La retenue est donné par [left2, right2]
                 */
                unsigned int right2 = 0;
                unsigned int left2 = 0;
                unsigned int left1 = 0;
                /*
                 * On initialise a la valeur de la retenue précédente
                 */
                unsigned int right1 = retenue;
                retenue = 0;

                /*
                 * Valeurs sur 16bits ! Si ca dépasse on fait passer l'exédent sur les 16bits suivants
                 * right1 -> left1
                 * left1 -> right2
                 * right2 -> left2
                 * left2 -> retenue
                 */
                left1 = right1 / SIZE_INT16;
                right1 = right1 % SIZE_INT16;

                /*
                 * On additionne avec prudence en vérifiant les overflows possible
                 * pour former le résultat et la retenue sur 32 bits
                 */
                if (SIZE_INT16 - right1 > (res1 & 0x0000FFFF)) {
                    right1 += (res1 & 0x0000FFFF);
                } else {
                    right1 -= SIZE_INT16;
                    right1 += (res1 & 0x0000FFFF);
                    left1 += 1;
                }

                if (SIZE_INT16 - left1 > (res1 >> 16)) {
                    left1 += (res1 >> 16);
                } else {
                    left1 -= SIZE_INT16;
                    left1 += (res1 >> 16);
                    right2 += 1;
                }

                if (SIZE_INT16 - left1 > (res2 & 0x0000FFFF)) {
                    left1 += (res2 & 0x0000FFFF);
                } else {
                    left1 -= SIZE_INT16;
                    left1 += (res2 & 0x0000FFFF);
                    right2 += 1;
                }

                if (SIZE_INT16 - left1 > (res3 & 0x0000FFFF)) {
                    left1 += (res3 & 0x0000FFFF);
                } else {
                    left1 -= SIZE_INT16;
                    left1 += (res3 & 0x0000FFFF);
                    right2 += 1;
                }

                /*
                 * Calcul de la retenue
                 */

                if (SIZE_INT16 - right2 > (res4 & 0x0000FFFF)) {
                    right2 += (res4 & 0x0000FFFF);
                } else {
                    right2 -= SIZE_INT16;
                    right2 += (res4 & 0x0000FFFF);
                    left2 += 1;
                }

                if (SIZE_INT16 - right2 > (res2 >> 16)) {
                    right2 += (res2 >> 16);
                } else {
                    right2 -= SIZE_INT16;
                    right2 += (res2 >> 16);
                    left2 += 1;
                }

                if (SIZE_INT16 - right2 > (res3 >> 16)) {
                    right2 += (res3 >> 16);
                } else {
                    right2 -= SIZE_INT16;
                    right2 += (res3 >> 16);
                    left2 += 1;
                }

                if (SIZE_INT16 - left2 > (res4 >> 16)) {
                    left2 += (res4 >> 16);
                } else {
                    left2 -= SIZE_INT16;
                    left2 += (res4 >> 16);
                    retenue += 1;
                }

                retenue += (left2 << 16) + right2;
                resultat32b += (left1 << 16) + right1;
                if (nb1.m_base < 4294967296) {
                    resultat32b = resultat32b % (unsigned int) nb1.m_base;
                    retenue = resultat32b / (unsigned int) nb1.m_base;
                }
                resultat_intermedaire.emplace_back(resultat32b);
            }
        }

        if(retenue != 0){
            resultat_intermedaire.emplace_back(retenue);
        }
        BigNumber tmp(resultat_intermedaire, nb1.m_base);
        tmp >> i;
        resultat = resultat + tmp;
    }
//    t2 = clock();
//    t_tmp += (t2 - t1);
//    cmp += 1;
//    cout << "Multiplication : " << t_tmp / (float)cmp << endl;

    return resultat;
}